

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

_Bool hex_decode(char *str,size_t slen,void *buf,size_t bufsize)

{
  _Bool _Var1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar v2;
  uchar v1;
  undefined8 uStack_38;
  
  sVar2 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    if (slen < 2) {
      return slen == 0 && bufsize == sVar2;
    }
    _Var1 = char_to_hex((uchar *)((long)&uStack_38 + 7),str[sVar2 * 2]);
    if (!_Var1) {
      return false;
    }
    _Var1 = char_to_hex((uchar *)((long)&uStack_38 + 6),str[sVar2 * 2 + 1]);
    if (!_Var1) {
      return false;
    }
    if (bufsize == sVar2) break;
    *(byte *)((long)buf + sVar2) = uStack_38._7_1_ << 4 | uStack_38._6_1_;
    slen = slen - 2;
    sVar2 = sVar2 + 1;
  }
  return false;
}

Assistant:

bool hex_decode(const char *str, size_t slen, void *buf, size_t bufsize)
{
	unsigned char v1, v2;
	unsigned char *p = buf;

	while (slen > 1) {
		if (!char_to_hex(&v1, str[0]) || !char_to_hex(&v2, str[1]))
			return false;
		if (!bufsize)
			return false;
		*(p++) = (v1 << 4) | v2;
		str += 2;
		slen -= 2;
		bufsize--;
	}
	return slen == 0 && bufsize == 0;
}